

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O1

string * __thiscall
gflags::DescribeOneFlag_abi_cxx11_
          (string *__return_storage_ptr__,gflags *this,CommandLineFlagInfo *flag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  long *plVar8;
  size_type *psVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  _Alloc_hider __s;
  int chars_in_line;
  string main_part;
  int local_a4;
  string local_a0;
  CommandLineFlagInfo *local_80;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_80 = (CommandLineFlagInfo *)this;
  SStringPrintf(&local_50,"    -%s (%s)",*(undefined8 *)this,*(undefined8 *)(this + 0x40));
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_a4 = 0;
  __s._M_p = local_50._M_dataplus._M_p;
  iVar10 = (int)local_50._M_string_length;
  do {
    sVar6 = strlen(__s._M_p);
    if (sVar6 != (long)iVar10) {
      __assert_fail("static_cast<size_t>(chars_left) == strlen(c_string)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags_reporting.cc"
                    ,0x82,"string gflags::DescribeOneFlag(const CommandLineFlagInfo &)");
    }
    pcVar7 = strchr(__s._M_p,10);
    if (pcVar7 == (char *)0x0) {
      if (0x4f < local_a4 + iVar10) goto LAB_0011097a;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_a4 = local_a4 + iVar10;
LAB_00110a7a:
      iVar5 = 3;
    }
    else if ((long)pcVar7 - (long)__s._M_p < 0x50 - (long)local_a4) {
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)__s._M_p);
      uVar11 = (uint)((long)pcVar7 - (long)__s._M_p);
      iVar10 = ~uVar11 + iVar10;
      __s._M_p = __s._M_p + (long)(int)uVar11 + 1;
LAB_00110a57:
      if (*__s._M_p == '\0') goto LAB_00110a7a;
      StringAppendF(__return_storage_ptr__,"\n      ");
      local_a4 = 6;
      iVar5 = 0;
    }
    else {
LAB_0011097a:
      uVar11 = 0x4f - local_a4;
      bVar3 = 0 < (int)uVar11;
      if ((int)uVar11 < 1) {
LAB_00110a3a:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_a4 = 0x50;
        iVar5 = 3;
      }
      else {
        uVar12 = (ulong)uVar11;
        iVar5 = isspace((int)__s._M_p[uVar12]);
        if (iVar5 == 0) {
          do {
            bVar3 = 1 < (long)uVar12;
            if ((long)uVar12 < 2) goto LAB_00110a3a;
            lVar4 = uVar12 - 1;
            uVar12 = uVar12 - 1;
            iVar5 = isspace((int)__s._M_p[lVar4]);
          } while (iVar5 == 0);
          uVar11 = (uint)uVar12;
        }
        if (!bVar3) goto LAB_00110a3a;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,__s._M_p,__s._M_p + (uVar12 & 0xffffffff));
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        local_a4 = local_a4 + (int)uVar12;
        __s._M_p = __s._M_p + ((ulong)uVar11 - 1);
        iVar10 = (iVar10 - uVar11) + 1;
        do {
          pcVar7 = __s._M_p + 1;
          __s._M_p = __s._M_p + 1;
          iVar5 = isspace((int)*pcVar7);
          iVar10 = iVar10 + -1;
        } while (iVar5 != 0);
        iVar5 = 0;
      }
      if (bVar3) goto LAB_00110a57;
    }
    if (iVar5 != 0) {
      paVar1 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"type: ","");
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_78,(ulong)(local_80->type)._M_dataplus._M_p);
      paVar2 = &local_a0.field_2;
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0.field_2._8_8_ = plVar8[3];
        local_a0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_a0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      AddString(&local_a0,__return_storage_ptr__,&local_a4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"default","");
      PrintStringFlagsWithQuotes(&local_a0,local_80,&local_78,false);
      AddString(&local_a0,__return_storage_ptr__,&local_a4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if (local_80->is_default == false) {
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"currently","");
        PrintStringFlagsWithQuotes(&local_a0,local_80,&local_78,true);
        AddString(&local_a0,__return_storage_ptr__,&local_a4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      StringAppendF(__return_storage_ptr__,"\n");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string DescribeOneFlag(const CommandLineFlagInfo& flag) {
  string main_part;
  SStringPrintf(&main_part, "    -%s (%s)",
                flag.name.c_str(),
                flag.description.c_str());
  const char* c_string = main_part.c_str();
  int chars_left = static_cast<int>(main_part.length());
  string final_string;
  int chars_in_line = 0;  // how many chars in current line so far?
  while (1) {
    assert(static_cast<size_t>(chars_left)
            == strlen(c_string));  // Unless there's a \0 in there?
    const char* newline = strchr(c_string, '\n');
    if (newline == NULL && chars_in_line+chars_left < kLineLength) {
      // The whole remainder of the string fits on this line
      final_string += c_string;
      chars_in_line += chars_left;
      break;
    }
    if (newline != NULL && newline - c_string < kLineLength - chars_in_line) {
      int n = static_cast<int>(newline - c_string);
      final_string.append(c_string, n);
      chars_left -= n + 1;
      c_string += n + 1;
    } else {
      // Find the last whitespace on this 80-char line
      int whitespace = kLineLength-chars_in_line-1;  // < 80 chars/line
      while ( whitespace > 0 && !isspace(c_string[whitespace]) ) {
        --whitespace;
      }
      if (whitespace <= 0) {
        // Couldn't find any whitespace to make a line break.  Just dump the
        // rest out!
        final_string += c_string;
        chars_in_line = kLineLength;  // next part gets its own line for sure!
        break;
      }
      final_string += string(c_string, whitespace);
      chars_in_line += whitespace;
      while (isspace(c_string[whitespace]))  ++whitespace;
      c_string += whitespace;
      chars_left -= whitespace;
    }
    if (*c_string == '\0')
      break;
    StringAppendF(&final_string, "\n      ");
    chars_in_line = 6;
  }

  // Append data type
  AddString(string("type: ") + flag.type, &final_string, &chars_in_line);
  // The listed default value will be the actual default from the flag
  // definition in the originating source file, unless the value has
  // subsequently been modified using SetCommandLineOptionWithMode() with mode
  // SET_FLAGS_DEFAULT, or by setting FLAGS_foo = bar before ParseCommandLineFlags().
  AddString(PrintStringFlagsWithQuotes(flag, "default", false), &final_string,
            &chars_in_line);
  if (!flag.is_default) {
    AddString(PrintStringFlagsWithQuotes(flag, "currently", true),
              &final_string, &chars_in_line);
  }

  StringAppendF(&final_string, "\n");
  return final_string;
}